

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

void cram_byte_array_len_encode_free(cram_codec *c)

{
  cram_codec *pcVar1;
  
  if (c != (cram_codec *)0x0) {
    pcVar1 = (c->field_6).e_byte_array_len.len_codec;
    if (pcVar1 != (cram_codec *)0x0) {
      (*pcVar1->free)(pcVar1);
    }
    pcVar1 = (c->field_6).e_byte_array_len.val_codec;
    if (pcVar1 != (cram_codec *)0x0) {
      (*pcVar1->free)(pcVar1);
    }
    free(c);
    return;
  }
  return;
}

Assistant:

void cram_byte_array_len_encode_free(cram_codec *c) {
    if (!c)
	return;

    if (c->e_byte_array_len.len_codec)
	c->e_byte_array_len.len_codec->free(c->e_byte_array_len.len_codec);

    if (c->e_byte_array_len.val_codec)
	c->e_byte_array_len.val_codec->free(c->e_byte_array_len.val_codec);

    free(c);
}